

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

optional<BCLog::Level> GetLogLevel(string_view level_str)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  char *__s1;
  size_t sVar4;
  ulong uVar5;
  size_type __rlen;
  long in_FS_OFFSET;
  
  __s1 = level_str._M_str;
  sVar4 = level_str._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 4;
  uVar3 = 0x100000000;
  if (sVar4 == 4) {
    iVar2 = bcmp(__s1,"info",4);
    if (iVar2 == 0) {
      uVar5 = 2;
      goto LAB_0016d0a2;
    }
  }
  else if (sVar4 == 7) {
    iVar2 = bcmp(__s1,"warning",7);
    if (iVar2 == 0) {
      uVar5 = 3;
      goto LAB_0016d0a2;
    }
  }
  else if (sVar4 == 5) {
    iVar2 = bcmp(__s1,"trace",5);
    if (iVar2 == 0) {
      uVar5 = 0;
    }
    else {
      iVar2 = bcmp(__s1,"debug",5);
      if (iVar2 == 0) {
        uVar5 = 1;
      }
      else {
        iVar2 = bcmp(__s1,"error",5);
        if (iVar2 != 0) {
          uVar3 = 0;
        }
      }
    }
    goto LAB_0016d0a2;
  }
  uVar3 = 0;
LAB_0016d0a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<BCLog::Level,_true,_true>)
           (_Optional_base<BCLog::Level,_true,_true>)(uVar3 | uVar5);
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<BCLog::Level> GetLogLevel(std::string_view level_str)
{
    if (level_str == "trace") {
        return BCLog::Level::Trace;
    } else if (level_str == "debug") {
        return BCLog::Level::Debug;
    } else if (level_str == "info") {
        return BCLog::Level::Info;
    } else if (level_str == "warning") {
        return BCLog::Level::Warning;
    } else if (level_str == "error") {
        return BCLog::Level::Error;
    } else {
        return std::nullopt;
    }
}